

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::from_chars(c4 *this,csubstr buf,raw_wrapper *r)

{
  c4 *pcVar1;
  undefined8 *puVar2;
  char *pcVar3;
  c4 *__src;
  
  puVar2 = (undefined8 *)buf.len;
  pcVar3 = buf.str;
  if (pcVar3 < (char *)puVar2[1]) {
    __src = (c4 *)0x0;
  }
  else {
    pcVar1 = (c4 *)(-puVar2[2] & (ulong)(this + puVar2[2] + -1));
    __src = (c4 *)0x0;
    if ((ulong)((long)pcVar1 - (long)this) <= (ulong)((long)pcVar3 - puVar2[1])) {
      __src = pcVar1;
    }
  }
  if (__src == (c4 *)0x0) {
    from_chars();
  }
  if ((__src < this) || (this + (long)pcVar3 < __src)) {
    from_chars();
  }
  memcpy((void *)*puVar2,__src,puVar2[1]);
  return true;
}

Assistant:

bool from_chars(csubstr buf, fmt::raw_wrapper *r)
{
    void * vptr = (void*)buf.str;
    size_t space = buf.len;
    auto ptr = (decltype(buf.str)) std::align(r->alignment, r->len, vptr, space);
    C4_CHECK(ptr != nullptr);
    C4_CHECK(ptr >= buf.begin() && ptr <= buf.end());
    //size_t dim = (ptr - buf.str) + r->len;
    memcpy(r->buf, ptr, r->len);
    return true;
}